

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int execute_filter(archive_read *a,rar_filter *filter,rar_virtual_machine *vm,size_t pos)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char cVar10;
  char cVar11;
  uint uVar12;
  uint8_t *puVar13;
  int iVar14;
  uint8_t byte;
  byte bVar15;
  int iVar16;
  char cVar17;
  uint uVar18;
  uint uVar19;
  uint8_t *puVar20;
  ulong uVar21;
  uint8_t uVar22;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  int local_78 [4];
  int local_68 [7];
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  byte local_38;
  undefined3 uStack_37;
  
  uVar4 = filter->prog->fingerprint;
  if ((long)uVar4 < 0x393cd7e57e) {
    if (uVar4 != 0x1d0e06077d) {
      if (uVar4 != 0x35ad576887) {
LAB_0024bb00:
        archive_set_error(&a->archive,0x54,"No support for RAR VM program filter");
        return 0;
      }
      iVar7 = 0;
      goto LAB_0024b9a3;
    }
    uVar2 = filter->initialregisters[4];
    if (0x1e000 < (ulong)uVar2) {
      return 0;
    }
    uVar3 = filter->initialregisters[0];
    if (uVar3 != 0) {
      puVar13 = vm->memory;
      uVar27 = 0;
      do {
        if (uVar27 < uVar2) {
          uVar22 = '\0';
          uVar26 = uVar27;
          do {
            if (vm->memory + uVar2 <= puVar13) {
              return 0;
            }
            uVar22 = uVar22 - *puVar13;
            puVar13 = puVar13 + 1;
            (vm->memory + uVar2)[uVar26] = uVar22;
            uVar26 = uVar26 + uVar3;
          } while (uVar26 < uVar2);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar3);
    }
    filter->filteredblockaddress = uVar2;
    filter->filteredblocklength = uVar2;
  }
  else {
    if (uVar4 == 0x393cd7e57e) {
      iVar7 = 1;
LAB_0024b9a3:
      iVar7 = execute_filter_e8(filter,vm,pos,iVar7);
      return iVar7;
    }
    if (uVar4 == 0x951c2c5dc8) {
      uVar2 = filter->initialregisters[4];
      uVar9 = (ulong)uVar2;
      if (0x1e000 < uVar9) {
        return 0;
      }
      uVar25 = (ulong)filter->initialregisters[0];
      uVar27 = filter->initialregisters[1];
      uVar21 = (ulong)uVar27;
      if ((2 < uVar27 || uVar2 < 3) || uVar2 < filter->initialregisters[0]) {
        return 0;
      }
      puVar13 = vm->memory;
      puVar20 = vm->memory + uVar9;
      uVar30 = 0;
      do {
        bVar15 = 0;
        uVar29 = uVar30;
        do {
          if (puVar20 <= puVar13) {
            return 0;
          }
          if (puVar20 <= (char *)((long)vm + uVar29 + (uVar9 - uVar25) + 0x20)) {
            bVar1 = puVar20[uVar29 - uVar25];
            uVar31 = (uint)puVar20[uVar29 + (3 - uVar25)] - (uint)bVar1;
            uVar26 = -uVar31;
            if (0 < (int)uVar31) {
              uVar26 = uVar31;
            }
            uVar24 = (uint)bVar15 - (uint)bVar1;
            uVar12 = -uVar24;
            if (0 < (int)uVar24) {
              uVar12 = uVar24;
            }
            uVar24 = uVar24 + uVar31;
            uVar31 = -uVar24;
            if (0 < (int)uVar24) {
              uVar31 = uVar24;
            }
            if ((((uVar12 & 0xff) < (uVar26 & 0xff)) || (uVar31 < (uVar26 & 0xff))) &&
               (bVar15 = bVar1, (uVar12 & 0xff) <= uVar31)) {
              bVar15 = puVar20[uVar29 + (3 - uVar25)];
            }
          }
          bVar15 = bVar15 - *puVar13;
          puVar13 = puVar13 + 1;
          puVar20[uVar29] = bVar15;
          uVar29 = uVar29 + 3;
        } while (uVar29 < uVar9);
        uVar30 = uVar30 + 1;
      } while (uVar30 != 3);
      if (uVar27 < uVar2 - 2) {
        do {
          uVar22 = vm->memory[uVar21 + uVar9 + 1];
          vm->memory[uVar21 + uVar9] = vm->memory[uVar21 + uVar9] + uVar22;
          vm->memory[uVar21 + uVar9 + 2] = vm->memory[uVar21 + uVar9 + 2] + uVar22;
          uVar21 = uVar21 + 3;
        } while (uVar21 < uVar2 - 2);
      }
      filter->filteredblockaddress = uVar2;
      filter->filteredblocklength = uVar2;
    }
    else {
      if (uVar4 != 0xd8bc85e701) goto LAB_0024bb00;
      uVar2 = filter->initialregisters[4];
      if (0x1e000 < (ulong)uVar2) {
        return 0;
      }
      uVar3 = filter->initialregisters[0];
      if (uVar3 != 0) {
        puVar13 = vm->memory;
        uVar27 = 0;
        do {
          local_48 = 0;
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_4c = 0;
          if (uVar27 < uVar2) {
            local_68[0] = 0;
            local_68[1] = 0;
            local_68[2] = 0;
            local_68[3] = 0;
            local_68[6] = 0;
            local_68[5] = 0;
            local_68[4] = 0;
            cVar11 = '\0';
            cVar10 = '\0';
            cVar23 = '\0';
            cVar17 = '\0';
            uVar26 = uVar27;
            iVar7 = 0;
            uVar31 = 0;
            uVar12 = 0;
            uVar24 = 0;
            do {
              if (vm->memory + uVar2 <= puVar13) {
                return 0;
              }
              iVar16 = (int)(char)*puVar13;
              iVar14 = (int)cVar23;
              uVar28 = iVar14 - iVar7;
              local_38 = (char)((int)cVar11 * (uVar31 & 0xffff) + uVar12 * 8 + (int)cVar10 * uVar28
                                + cVar17 * iVar14 >> 3) - *puVar13;
              uVar5 = iVar16 * 8;
              uVar18 = iVar14 + iVar16 * 8;
              uVar19 = uVar5 - (int)(short)uVar28;
              iVar7 = (int)(short)uVar28 + iVar16 * 8;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              local_68[4] = iVar6 + local_68[4];
              iVar6 = uVar5 - (int)(short)uVar31;
              iVar7 = -iVar6;
              if (0 < iVar6) {
                iVar7 = iVar6;
              }
              local_68[5] = iVar7 + local_68[5];
              iVar7 = (int)(short)uVar31 + iVar16 * 8;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              uVar31 = (int)(uVar5 - iVar14) >> 0x1f;
              uVar32 = (int)uVar18 >> 0x1f;
              uVar33 = (int)uVar19 >> 0x1f;
              local_68[0] = ((uVar5 ^ (int)uVar5 >> 0x1f) - ((int)uVar5 >> 0x1f)) + local_68[0];
              local_68[1] = ((uVar5 - iVar14 ^ uVar31) - uVar31) + local_68[1];
              local_68[2] = ((uVar18 ^ uVar32) - uVar32) + local_68[2];
              local_68[3] = ((uVar19 ^ uVar33) - uVar33) + local_68[3];
              local_68[6] = iVar6 + local_68[6];
              cVar23 = local_38 - (char)uVar12;
              uStack_37 = 0;
              (vm->memory + uVar2)[uVar26] = local_38;
              uStack_3c = uVar24 + 1;
              if ((uVar24 & 0x1f) == 0) {
                lVar8 = 5;
                uVar9 = 0;
                do {
                  if (local_78[lVar8] < local_68[uVar9]) {
                    uVar9 = (ulong)((int)lVar8 - 4U & 0xff);
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0xb);
                local_48 = 0;
                uStack_44 = 0;
                uStack_40 = 0;
                uStack_4c = 0;
                local_68[0] = 0;
                local_68[1] = 0;
                local_68[2] = 0;
                local_68[3] = 0;
                local_68[6] = 0;
                switch((int)uVar9) {
                case 1:
                  if (-0x11 < cVar17) {
                    cVar17 = cVar17 + -1;
                  }
                  break;
                case 2:
                  if (cVar17 < '\x10') {
                    cVar17 = cVar17 + '\x01';
                  }
                  break;
                case 3:
                  if (-0x11 < cVar10) {
                    cVar10 = cVar10 + -1;
                  }
                  break;
                case 4:
                  if (cVar10 < '\x10') {
                    cVar10 = cVar10 + '\x01';
                  }
                  break;
                case 5:
                  if (-0x11 < cVar11) {
                    cVar11 = cVar11 + -1;
                  }
                  break;
                case 6:
                  if (cVar11 < '\x10') {
                    cVar11 = cVar11 + '\x01';
                  }
                }
                local_68[5] = 0;
                local_68[4] = 0;
              }
              puVar13 = puVar13 + 1;
              uVar26 = uVar26 + uVar3;
              iVar7 = iVar14;
              uVar31 = uVar28;
              uVar12 = (uint)local_38;
              uVar24 = uVar24 + 1;
            } while (uVar26 < uVar2);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar3);
      }
      filter->filteredblockaddress = uVar2;
      filter->filteredblocklength = uVar2;
    }
  }
  return 1;
}

Assistant:

static int
execute_filter(struct archive_read *a, struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos)
{
  if (filter->prog->fingerprint == 0x1D0E06077D)
    return execute_filter_delta(filter, vm);
  if (filter->prog->fingerprint == 0x35AD576887)
    return execute_filter_e8(filter, vm, pos, 0);
  if (filter->prog->fingerprint == 0x393CD7E57E)
    return execute_filter_e8(filter, vm, pos, 1);
  if (filter->prog->fingerprint == 0x951C2C5DC8)
    return execute_filter_rgb(filter, vm);
  if (filter->prog->fingerprint == 0xD8BC85E701)
    return execute_filter_audio(filter, vm);

  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT, "No support for RAR VM program filter");
  return 0;
}